

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

bool isRotationMatrix(Mat *R)

{
  _InputArray *p_Var1;
  double dVar2;
  _InputArray local_2b0;
  Mat shouldBeIdentity;
  Mat Rt;
  Mat I;
  _InputArray local_178 [14];
  
  cv::Mat::Mat(&Rt);
  local_178[0].sz.width = 0;
  local_178[0].sz.height = 0;
  local_178[0].flags = 0x1010000;
  _shouldBeIdentity = 0x2010000;
  local_178[0].obj = R;
  cv::transpose(local_178,(_OutputArray *)&shouldBeIdentity);
  cv::operator*((Mat *)local_178,&Rt);
  cv::MatExpr::operator_cast_to_Mat((MatExpr *)&shouldBeIdentity);
  cv::MatExpr::~MatExpr((MatExpr *)local_178);
  cv::Mat::eye((int)local_178,3,3);
  cv::MatExpr::operator_cast_to_Mat((MatExpr *)&I);
  cv::MatExpr::~MatExpr((MatExpr *)local_178);
  local_178[0].sz.width = 0;
  local_178[0].sz.height = 0;
  local_2b0.sz.width = 0;
  local_2b0.sz.height = 0;
  local_178[0].flags = 0x1010000;
  local_2b0.flags = 0x1010000;
  local_2b0.obj = (MatExpr *)&shouldBeIdentity;
  local_178[0].obj = (MatExpr *)&I;
  p_Var1 = (_InputArray *)cv::noArray();
  dVar2 = (double)cv::norm(local_178,&local_2b0,4,p_Var1);
  cv::Mat::~Mat(&I);
  cv::Mat::~Mat(&shouldBeIdentity);
  cv::Mat::~Mat(&Rt);
  return dVar2 < 1e-06;
}

Assistant:

bool isRotationMatrix(cv::Mat &R)
{
    cv::Mat Rt;
    transpose(R, Rt);
    cv::Mat shouldBeIdentity = Rt * R;
    cv::Mat I = cv::Mat::eye(3,3, shouldBeIdentity.type());
     
    return  norm(I, shouldBeIdentity) < 1e-6;
     
}